

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

EnumValueDescriptorProto *
google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>::New
          (Arena *arena)

{
  Arena *arena_local;
  EnumValueDescriptorProto *local_28;
  EnumValueDescriptorProto *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (EnumValueDescriptorProto *)operator_new(0x30);
    EnumValueDescriptorProto::EnumValueDescriptorProto(local_28);
  }
  else {
    local_28 = (EnumValueDescriptorProto *)
               Arena::AllocateAligned(arena,(type_info *)&EnumValueDescriptorProto::typeinfo,0x30);
    EnumValueDescriptorProto::EnumValueDescriptorProto(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<google::protobuf::EnumValueDescriptorProto>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }